

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

void munmap_checked(void *addr,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  void *ptr;
  uint uVar5;
  ulong *puVar6;
  char cVar7;
  ulong *puVar8;
  bool bVar9;
  ulong local_58;
  char buf [64];
  
  iVar3 = munmap(addr,size);
  if (iVar3 == 0) {
    return;
  }
  puVar8 = &local_58;
  munmap_checked_cold_1();
  do {
    uVar2 = *puVar8;
    puVar6 = (ulong *)(uVar2 & 0xffffffffffff0000);
    if (puVar6 == (ulong *)0x0) {
      bVar9 = false;
      addr = (ulong *)0x0;
    }
    else {
      LOCK();
      uVar4 = *puVar8;
      if (uVar2 == uVar4) {
        *puVar8 = uVar2 & 0xffff | *puVar6 & 0xffffffffffff0000;
        uVar4 = uVar2;
      }
      UNLOCK();
      bVar9 = uVar2 != uVar4;
      if (!bVar9) {
        addr = puVar6;
      }
    }
  } while (bVar9);
  if ((ulong *)addr == (ulong *)0x0) {
    uVar2 = puVar8[5];
    if ((ulong)(uint)uVar2 == 0) {
      __assert_fail("size_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x89,"ssize_t quota_use(struct quota *, size_t)");
    }
    puVar6 = (ulong *)puVar8[4];
    do {
      uVar4 = *puVar6;
      uVar5 = (uint)uVar4 + (int)((ulong)(uint)uVar2 + 0x3ff >> 10);
      if (uVar5 <= (uint)uVar4) {
        __assert_fail("new_used_in_units > used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x90,"ssize_t quota_use(struct quota *, size_t)");
      }
      cVar7 = '\x01';
      if (uVar5 <= (uint)(uVar4 >> 0x20)) {
        LOCK();
        uVar1 = *puVar6;
        if (uVar4 == uVar1) {
          *puVar6 = (ulong)uVar5 | uVar4 & 0xffffffff00000000;
        }
        UNLOCK();
        cVar7 = (uVar4 == uVar1) * '\x03';
      }
    } while (cVar7 == '\0');
    if (cVar7 == '\x03') {
      LOCK();
      puVar6 = puVar8 + 3;
      uVar2 = *puVar6;
      *puVar6 = *puVar6 + (ulong)(uint)puVar8[5];
      UNLOCK();
      uVar4 = (ulong)(uint)puVar8[5];
      if (puVar8[2] < uVar2 + uVar4) {
        ptr = mmap_checked(uVar4,uVar4,*(int *)((long)puVar8 + 0x2c));
        if (ptr == (void *)0x0) {
          LOCK();
          puVar8[3] = puVar8[3] - (ulong)(uint)puVar8[5];
          UNLOCK();
          uVar2 = puVar8[5];
          if ((ulong)(uint)uVar2 == 0) {
            __assert_fail("size_in_units",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                          ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
          }
          puVar6 = (ulong *)puVar8[4];
          do {
            uVar4 = *puVar6;
            uVar5 = (uint)((ulong)(uint)uVar2 + 0x3ff >> 10);
            if ((uint)uVar4 < uVar5) {
              __assert_fail("size_in_units <= used_in_units",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                            ,0xab,"ssize_t quota_release(struct quota *, size_t)");
            }
            LOCK();
            uVar1 = *puVar6;
            if (uVar4 == uVar1) {
              *puVar6 = (ulong)((uint)uVar4 - uVar5) | uVar4 & 0xffffffff00000000;
            }
            UNLOCK();
          } while (uVar4 != uVar1);
        }
        madvise_checked(ptr,(ulong)(uint)puVar8[5],*(int *)((long)puVar8 + 0x2c));
      }
    }
  }
  return;
}

Assistant:

static void
munmap_checked(void *addr, size_t size)
{
	if (munmap(addr, size)) {
		char buf[64];
		intptr_t ignore_it = (intptr_t)strerror_r(errno, buf,
							  sizeof(buf));
		(void)ignore_it;
		fprintf(stderr, "Error in munmap(%p, %zu): %s\n",
			addr, size, buf);
		assert(false);
	}
}